

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::GetLocalVariable(SQFuncState *this,SQObject *name)

{
  SQLocalVarInfo *pSVar1;
  long in_RSI;
  long in_RDI;
  SQLocalVarInfo *lvi;
  SQInteger locals;
  SQUnsignedInteger local_20;
  
  local_20 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 8));
  while( true ) {
    if ((long)local_20 < 1) {
      return -1;
    }
    pSVar1 = sqvector<SQLocalVarInfo>::operator[]
                       ((sqvector<SQLocalVarInfo> *)(in_RDI + 8),local_20 - 1);
    if (((pSVar1->_name).super_SQObject._type == OT_STRING) &&
       ((pSVar1->_name).super_SQObject._unVal.pTable == *(SQTable **)(in_RSI + 8))) break;
    local_20 = local_20 - 1;
  }
  return local_20 - 1;
}

Assistant:

SQInteger SQFuncState::GetLocalVariable(const SQObject &name)
{
    SQInteger locals=_vlocals.size();
    while(locals>=1){
        SQLocalVarInfo &lvi = _vlocals[locals-1];
        if(sq_type(lvi._name)==OT_STRING && _string(lvi._name)==_string(name)){
            return locals-1;
        }
        locals--;
    }
    return -1;
}